

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O2

GuardBuilder * __thiscall
r_exec::CTPX::find_guard_builder(CTPX *this,_Fact *cause,_Fact *consequent,uint64_t period)

{
  _Object *p_Var1;
  byte bVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  ushort uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  SGuardBuilder *pSVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ushort cmd_arg_index;
  Atom *this_00;
  ushort uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Atom s_2;
  Atom s_1;
  Atom s;
  
  iVar7 = (*(cause->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(cause,0);
  pSVar8 = (SGuardBuilder *)CONCAT44(extraout_var,iVar7);
  (*(((CmdGuardBuilder *)&pSVar8->super_TimingGuardBuilder)->super_TimingGuardBuilder).
    super_GuardBuilder.super__Object._vptr__Object[4])(pSVar8,0);
  sVar5 = r_code::Atom::asOpcode();
  if (sVar5 == Opcodes::Cmd) {
    p_Var1 = (this->super__TPX).super_TPX.target.object;
    iVar7 = (*p_Var1->_vptr__Object[9])(p_Var1,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x20))
              ((long *)CONCAT44(extraout_var_00,iVar7),3);
    fVar13 = (float)r_code::Atom::asFloat();
    iVar7 = (*(consequent->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object._vptr__Object[9])(consequent,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x20))
              ((long *)CONCAT44(extraout_var_01,iVar7),3);
    fVar14 = (float)r_code::Atom::asFloat();
    (*(((CmdGuardBuilder *)&pSVar8->super_TimingGuardBuilder)->super_TimingGuardBuilder).
      super_GuardBuilder.super__Object._vptr__Object[4])(pSVar8,2);
    uVar6 = r_code::Atom::asIndex();
    (*(((CmdGuardBuilder *)&pSVar8->super_TimingGuardBuilder)->super_TimingGuardBuilder).
      super_GuardBuilder.super__Object._vptr__Object[4])(pSVar8,(ulong)uVar6);
    bVar2 = r_code::Atom::getAtomCount();
    uVar11 = (ushort)bVar2;
    cmd_arg_index = uVar6;
    while( true ) {
      cmd_arg_index = cmd_arg_index + 1;
      bVar12 = uVar11 == 0;
      uVar11 = uVar11 - 1;
      if (bVar12) break;
      iVar7 = (*(((CmdGuardBuilder *)&pSVar8->super_TimingGuardBuilder)->super_TimingGuardBuilder).
                super_GuardBuilder.super__Object._vptr__Object[4])(pSVar8,(ulong)cmd_arg_index);
      _s = *(undefined4 *)CONCAT44(extraout_var_02,iVar7);
      cVar3 = r_code::Atom::isFloat();
      if (cVar3 != '\0') {
        fVar15 = (float)r_code::Atom::asFloat();
        cVar3 = r_code::Utils::Equal((double)fVar15,(double)(fVar14 - fVar13));
        if (cVar3 != '\0') {
          pSVar8 = (SGuardBuilder *)operator_new(0x20);
          ACGuardBuilder::ACGuardBuilder((ACGuardBuilder *)pSVar8,period,cmd_arg_index);
          this_00 = &s;
          goto LAB_001a2455;
        }
      }
      r_code::Atom::~Atom(&s);
    }
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      while (uVar6 = uVar6 + 1, uVar6 <= bVar2) {
        iVar7 = (*(((CmdGuardBuilder *)&pSVar8->super_TimingGuardBuilder)->super_TimingGuardBuilder)
                  .super_GuardBuilder.super__Object._vptr__Object[4])(pSVar8,(ulong)(uint)uVar6);
        _s_1 = *(undefined4 *)CONCAT44(extraout_var_06,iVar7);
        cVar3 = r_code::Atom::isFloat();
        if (cVar3 != '\0') {
          fVar15 = (float)r_code::Atom::asFloat();
          cVar3 = r_code::Utils::Equal((double)fVar15,(double)(fVar14 / fVar13));
          if (cVar3 != '\0') {
            pSVar8 = (SGuardBuilder *)operator_new(0x20);
            MCGuardBuilder::MCGuardBuilder((MCGuardBuilder *)pSVar8,period,(double)uVar6);
            this_00 = &s_1;
LAB_001a2455:
            r_code::Atom::~Atom(this_00);
            return (GuardBuilder *)pSVar8;
          }
        }
        r_code::Atom::~Atom(&s_1);
      }
    }
  }
  else if (sVar5 == Opcodes::MkVal) {
    iVar7 = (*(((CmdGuardBuilder *)&pSVar8->super_TimingGuardBuilder)->super_TimingGuardBuilder).
              super_GuardBuilder.super__Object._vptr__Object[4])(pSVar8,3);
    _s_2 = *(undefined4 *)CONCAT44(extraout_var_03,iVar7);
    cVar3 = r_code::Atom::isFloat();
    if (cVar3 != '\0') {
      fVar13 = (float)r_code::Atom::asFloat();
      p_Var1 = (this->super__TPX).super_TPX.target.object;
      iVar7 = (*p_Var1->_vptr__Object[9])(p_Var1,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x20))
                ((long *)CONCAT44(extraout_var_04,iVar7),3);
      fVar14 = (float)r_code::Atom::asFloat();
      iVar7 = (*(consequent->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object._vptr__Object[9])(consequent,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x20))
                ((long *)CONCAT44(extraout_var_05,iVar7),3);
      fVar15 = (float)r_code::Atom::asFloat();
      cVar4 = r_code::Utils::Equal((double)fVar13,(double)((fVar15 - fVar14) / (float)period));
      if (cVar4 == '\0') {
        if ((fVar14 != 0.0) || (NAN(fVar14))) {
          uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
          uVar10 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(this->super__TPX).super_TPX.target.object,2);
          pSVar8 = (SGuardBuilder *)operator_new(0x28);
          MGuardBuilder::MGuardBuilder
                    ((MGuardBuilder *)pSVar8,period,(double)(fVar15 / fVar14),uVar9 - uVar10);
        }
        else {
          uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
          uVar10 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(this->super__TPX).super_TPX.target.object,2);
          pSVar8 = (SGuardBuilder *)operator_new(0x28);
          AGuardBuilder::AGuardBuilder
                    ((AGuardBuilder *)pSVar8,period,(double)(fVar15 - fVar14),uVar9 - uVar10);
        }
      }
      else {
        uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
        uVar10 = r_code::Utils::GetTimestamp<r_code::Code>
                           ((Code *)(this->super__TPX).super_TPX.target.object,2);
        pSVar8 = (SGuardBuilder *)operator_new(0x20);
        SGuardBuilder::SGuardBuilder(pSVar8,period,(period - uVar9) + uVar10);
      }
    }
    r_code::Atom::~Atom(&s_2);
    if (cVar3 != '\0') {
      return (GuardBuilder *)pSVar8;
    }
  }
  return (GuardBuilder *)(SGuardBuilder *)0x0;
}

Assistant:

GuardBuilder *CTPX::find_guard_builder(_Fact *cause, _Fact *consequent, uint64_t period)
{
    Code *cause_payload = cause->get_reference(0);
    uint16_t opcode = cause_payload->code(0).asOpcode();

    if (opcode == Opcodes::Cmd) { // form 0.
        float q0 = target->get_reference(0)->code(MK_VAL_VALUE).asFloat();
        float q1 = consequent->get_reference(0)->code(MK_VAL_VALUE).asFloat();
        float searched_for = q1 - q0;
        uint16_t cmd_arg_set_index = cause_payload->code(CMD_ARGS).asIndex();
        uint16_t cmd_arg_count = cause_payload->code(cmd_arg_set_index).getAtomCount();

        for (uint16_t i = 1; i <= cmd_arg_count; ++i) {
            Atom s = cause_payload->code(cmd_arg_set_index + i);

            if (!s.isFloat()) {
                continue;
            }

            float _s = s.asFloat();

            if (Utils::Equal(_s, searched_for)) {
                return new ACGuardBuilder(period, cmd_arg_set_index + i);
            }
        }

        if (q0 != 0) {
            searched_for = q1 / q0;

            for (uint16_t i = cmd_arg_set_index + 1; i <= cmd_arg_count; ++i) {
                Atom s = cause_payload->code(i);

                if (!s.isFloat()) {
                    continue;
                }

                float _s = s.asFloat();

                if (Utils::Equal(_s, searched_for)) {
                    return new MCGuardBuilder(period, i);
                }
            }
        }
    } else if (opcode == Opcodes::MkVal) {
        Atom s = cause_payload->code(MK_VAL_VALUE);

        if (s.isFloat()) {
            float _s = s.asFloat();
            float q0 = target->get_reference(0)->code(MK_VAL_VALUE).asFloat();
            float q1 = consequent->get_reference(0)->code(MK_VAL_VALUE).asFloat();
            float searched_for = (q1 - q0) / period;

            if (Utils::Equal(_s, searched_for)) { // form 1.
                uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
                return new SGuardBuilder(period, period - offset);
            }

            if (q0 != 0) { // form 2.
                uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
                return new MGuardBuilder(period, q1 / q0, offset);
            }

            uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
            return new AGuardBuilder(period, q1 - q0, offset);
        }
    }

    return nullptr;
}